

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

void __thiscall wirehair::Codec::SetDeferredColumns(Codec *this)

{
  ulong *puVar1;
  uint16_t uVar2;
  uint uVar3;
  PeelRefs *pPVar4;
  uint64_t *puVar5;
  uint16_t *puVar6;
  long lVar7;
  uint16_t uVar8;
  ushort *puVar9;
  ushort uVar10;
  ulong uVar11;
  ulong uVar12;
  uint16_t uVar13;
  ulong uVar14;
  ulong uVar15;
  
  uVar10 = this->_defer_head_columns;
  if (uVar10 != 0xffff) {
    uVar11 = 0;
    do {
      pPVar4 = this->_peel_col_refs;
      uVar12 = uVar11 & 0xffff;
      puVar9 = (ushort *)((long)&this->_peel_cols->Next + (ulong)((uint)uVar10 * 6));
      uVar14 = (ulong)pPVar4->Rows[(ulong)uVar10 + (ulong)uVar10 * 0x20 + -1];
      if (uVar14 != 0) {
        uVar3 = this->_ge_pitch;
        uVar15 = 0;
        puVar5 = this->_compress_matrix;
        do {
          lVar7 = (ulong)uVar10 * 0x20 + uVar15;
          uVar15 = uVar15 + 1;
          puVar1 = (ulong *)((long)puVar5 +
                            (ulong)(pPVar4->Rows[(ulong)uVar10 + lVar7] * uVar3) * 8 +
                            (ulong)(uint)((int)(uVar12 >> 6) << 3));
          *puVar1 = *puVar1 | 1L << (uVar11 & 0x3f);
        } while (uVar14 != uVar15);
      }
      this->_ge_col_map[uVar12] = uVar10;
      puVar9[1] = (ushort)uVar11;
      uVar11 = (ulong)((int)uVar12 + 1);
      uVar10 = *puVar9;
    } while (uVar10 != 0xffff);
  }
  uVar2 = this->_mix_count;
  if (uVar2 != 0) {
    puVar6 = this->_ge_col_map;
    uVar8 = 0;
    do {
      uVar13 = uVar8 + this->_block_count;
      uVar10 = this->_defer_count + uVar8;
      uVar8 = uVar8 + 1;
      puVar6[uVar10] = uVar13;
    } while (uVar2 != uVar8);
  }
  return;
}

Assistant:

void Codec::SetDeferredColumns()
{
    CAT_IF_DUMP(cout << endl << "---- SetDeferredColumns ----" << endl << endl;)

    PeelColumn * GF256_RESTRICT column;

    // For each deferred column:
    for (uint16_t ge_column_i = 0, defer_i = _defer_head_columns;
        defer_i != LIST_TERM;
        defer_i = column->Next, ++ge_column_i)
    {
        column = &_peel_cols[defer_i];

        CAT_IF_DUMP(cout << "GE column " << ge_column_i <<
            " mapped to matrix column " << defer_i << " :";)

        // Get pointer to this matrix row
        uint64_t *matrix_row_offset = _compress_matrix + (ge_column_i >> 6);

        // Get word mask for this column bit
        const uint64_t ge_mask = (uint64_t)1 << (ge_column_i & 63);

        // Get references for this deferred index
        const PeelRefs * GF256_RESTRICT refs = &_peel_col_refs[defer_i];

        // For each affected row:
        for (unsigned i = 0, count = refs->RowCount; i < count; ++i)
        {
            const uint16_t row_i = refs->Rows[i];

            CAT_IF_DUMP(cout << " " << row_i;)

            matrix_row_offset[_ge_pitch * row_i] |= ge_mask;
        }

        CAT_IF_DUMP(cout << endl;)

        // Set column map for this GE column
        _ge_col_map[ge_column_i] = defer_i;

        // Set reverse mapping also
        column->GEColumn = ge_column_i;
    }

    // Set column map for each mix column:
    for (uint16_t added_i = 0, count = _mix_count; added_i < count; ++added_i)
    {
        CAT_DEBUG_ASSERT((unsigned)_defer_count + (unsigned)added_i < 65536);
        CAT_DEBUG_ASSERT((unsigned)_block_count + (unsigned)added_i < 65536);
        const uint16_t ge_column_i = _defer_count + added_i;
        const uint16_t column_i = _block_count + added_i;

        CAT_IF_DUMP(cout << "GE column(mix) " << ge_column_i <<
            " mapped to matrix column " << column_i << endl;)

        _ge_col_map[ge_column_i] = column_i;
    }
}